

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  gvector in_RDX;
  inform_dist *in_RSI;
  ulong uVar1;
  
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if (*(long *)(ctx + -8) != 0) {
      uVar1 = 0;
      do {
        gvector_free(*(gvector *)(ctx + uVar1 * 8));
        uVar1 = uVar1 + 1;
      } while (uVar1 < *(ulong *)(ctx + -8));
    }
    gvector_free(ctx);
  }
  if (in_RSI != (inform_dist *)0x0) {
    inform_dist_free(in_RSI);
  }
  if (in_RDX != (gvector)0x0) {
    if (*(long *)((long)in_RDX + -8) != 0) {
      uVar1 = 0;
      do {
        gvector_free(*(gvector *)((long)in_RDX + uVar1 * 8));
        uVar1 = uVar1 + 1;
      } while (uVar1 < *(ulong *)((long)in_RDX + -8));
    }
    gvector_free(in_RDX);
    return;
  }
  return;
}

Assistant:

static void cleanup(size_t **subsets, inform_dist *s_dist, double **info)
{
    if (subsets)
    {
        for (size_t i = 0; i < gvector_len(subsets); ++i)
        {
            gvector_free(subsets[i]);
        }
        gvector_free(subsets);
    }

    if (s_dist)
    {
        inform_dist_free(s_dist);
    }

    if (info)
    {
        for (size_t i = 0; i < gvector_len(info); ++i)
        {
            gvector_free(info[i]);
        }
        gvector_free(info);
    }
}